

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O2

void isaac_gen_group(isaacctx *ctx)

{
  ulong uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  ulong uVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar9 = ctx->a;
  uVar2 = ctx->c + 1;
  ctx->c = uVar2;
  uVar2 = uVar2 + ctx->b;
  puVar5 = ctx->rsl;
  puVar6 = ctx->mem + 0x80;
  for (uVar1 = 0x404; uVar1 < 0x604; uVar1 = uVar1 + 0x10) {
    uVar4 = *(uint *)((long)ctx->rsl + (uVar1 - 4));
    uVar11 = (uVar9 << 0xd ^ uVar9) + *puVar6;
    uVar3 = uVar2 + uVar11 + *(int *)((long)ctx->mem + (ulong)(uVar4 & 0x3fc));
    *(uint *)((long)ctx->rsl + (uVar1 - 4)) = uVar3;
    uVar9 = uVar4 + *(int *)((long)ctx->mem + (ulong)(uVar3 >> 8 & 0x3fc));
    *puVar5 = uVar9;
    uVar3 = (uVar11 >> 6 ^ uVar11) + puVar6[1];
    uVar4 = *(uint *)((long)ctx->rsl + uVar1);
    uVar11 = uVar9 + uVar3 + *(int *)((long)ctx->mem + (ulong)(uVar4 & 0x3fc));
    *(uint *)((long)ctx->rsl + uVar1) = uVar11;
    uVar9 = uVar4 + *(int *)((long)ctx->mem + (ulong)(uVar11 >> 8 & 0x3fc));
    puVar5[1] = uVar9;
    uVar11 = (uVar3 * 4 ^ uVar3) + puVar6[2];
    uVar4 = *(uint *)((long)ctx->rsl + uVar1 + 4);
    uVar3 = uVar9 + uVar11 + *(int *)((long)ctx->mem + (ulong)(uVar4 & 0x3fc));
    *(uint *)((long)ctx->rsl + uVar1 + 4) = uVar3;
    uVar2 = uVar4 + *(int *)((long)ctx->mem + (ulong)(uVar3 >> 8 & 0x3fc));
    puVar5[2] = uVar2;
    uVar4 = *(uint *)((long)ctx->rsl + uVar1 + 8);
    uVar9 = (uVar11 >> 0x10 ^ uVar11) + puVar6[3];
    puVar6 = puVar6 + 4;
    uVar3 = uVar2 + uVar9 + *(int *)((long)ctx->mem + (ulong)(uVar4 & 0x3fc));
    *(uint *)((long)ctx->rsl + uVar1 + 8) = uVar3;
    uVar2 = uVar4 + *(int *)((long)ctx->mem + (ulong)(uVar3 >> 8 & 0x3fc));
    puVar5[3] = uVar2;
    puVar5 = puVar5 + 4;
  }
  for (uVar7 = 0x404; uVar7 < 0x604; uVar7 = uVar7 + 0x10) {
    uVar10 = (uVar9 << 0xd ^ uVar9) + *(int *)((long)ctx->rsl + (uVar7 - 4));
    uVar4 = *(uint *)((long)ctx + uVar7 + (uVar1 - 0x404));
    uVar11 = uVar2 + uVar10 + *(int *)((long)ctx->mem + (ulong)(uVar4 & 0x3fc));
    uVar3 = *(uint *)((long)ctx + uVar7 + (uVar1 - 0x400));
    *(uint *)((long)ctx + uVar7 + (uVar1 - 0x404)) = uVar11;
    iVar8 = uVar4 + *(int *)((long)ctx->mem + (ulong)(uVar11 >> 8 & 0x3fc));
    *(int *)((long)ctx + uVar7 + (uVar1 - 0x804)) = iVar8;
    uVar4 = (uVar10 >> 6 ^ uVar10) + *(int *)((long)ctx->rsl + uVar7);
    uVar11 = iVar8 + uVar4 + *(int *)((long)ctx->mem + (ulong)(uVar3 & 0x3fc));
    *(uint *)((long)ctx + uVar7 + (uVar1 - 0x400)) = uVar11;
    iVar8 = uVar3 + *(int *)((long)ctx->mem + (ulong)(uVar11 >> 8 & 0x3fc));
    *(int *)((long)ctx + uVar7 + (uVar1 - 0x800)) = iVar8;
    uVar11 = (uVar4 * 4 ^ uVar4) + *(int *)((long)ctx->rsl + uVar7 + 4);
    uVar4 = *(uint *)((long)ctx + uVar7 + (uVar1 - 0x3fc));
    uVar3 = iVar8 + uVar11 + *(int *)((long)ctx->mem + (ulong)(uVar4 & 0x3fc));
    *(uint *)((long)ctx + uVar7 + (uVar1 - 0x3fc)) = uVar3;
    iVar8 = uVar4 + *(int *)((long)ctx->mem + (ulong)(uVar3 >> 8 & 0x3fc));
    *(int *)((long)ctx + uVar7 + (uVar1 - 0x7fc)) = iVar8;
    uVar4 = *(uint *)((long)ctx + uVar7 + (uVar1 - 0x3f8));
    uVar9 = (uVar11 >> 0x10 ^ uVar11) + *(int *)((long)ctx->rsl + uVar7 + 8);
    uVar3 = iVar8 + uVar9 + *(int *)((long)ctx->mem + (ulong)(uVar4 & 0x3fc));
    *(uint *)((long)ctx + uVar7 + (uVar1 - 0x3f8)) = uVar3;
    uVar2 = uVar4 + *(int *)((long)ctx->mem + (ulong)(uVar3 >> 8 & 0x3fc));
    *(uint32_t *)((long)ctx + uVar7 + (uVar1 - 0x7f8)) = uVar2;
  }
  ctx->b = uVar2;
  ctx->a = uVar9;
  return;
}

Assistant:

void isaac_gen_group(isaacctx *ctx)
{
    uint32_t a;
    uint32_t b;
    uint32_t x;
    uint32_t y;
    uint32_t *m;
    uint32_t *mm;
    uint32_t *m2;
    uint32_t *r;
    uint32_t *mend;

    mm = ctx->mem;
    r = ctx->rsl;
    a = ctx->a;
    b = (ctx->b + (++ctx->c)) & 0xffffffff;
    for (m = mm, mend = m2 = m + (ISAAC_RANDSIZ/2) ; m<mend ; )
    {
        isaac_step(a<<13, a, b, mm, m, m2, r, x);
        isaac_step(a>>6,  a, b, mm, m, m2, r, x);
        isaac_step(a<<2,  a, b, mm, m, m2, r, x);
        isaac_step(a>>16, a, b, mm, m, m2, r, x);
    }
    for (m2 = mm; m2<mend; )
    {
        isaac_step(a<<13, a, b, mm, m, m2, r, x);
        isaac_step(a>>6,  a, b, mm, m, m2, r, x);
        isaac_step(a<<2,  a, b, mm, m, m2, r, x);
        isaac_step(a>>16, a, b, mm, m, m2, r, x);
    }
    ctx->b = b;
    ctx->a = a;
}